

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory_oob
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  undefined8 *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  xml_memory_page *page;
  size_t large_allocation_threshold;
  size_t in_stack_ffffffffffffffd0;
  xml_memory_page *local_8;
  
  local_8 = allocate_page((xml_allocator *)0x1ff6,in_stack_ffffffffffffffd0);
  *in_RDX = local_8;
  if (local_8 == (xml_memory_page *)0x0) {
    local_8 = (xml_memory_page *)0x0;
  }
  else {
    if (in_RSI < 0x1ff7) {
      *(long *)(*in_RDI + 0x18) = in_RDI[1];
      local_8->prev = (xml_memory_page *)*in_RDI;
      *(xml_memory_page **)(*in_RDI + 0x10) = local_8;
      *in_RDI = (long)local_8;
      in_RDI[1] = in_RSI;
    }
    else {
      local_8->prev = *(xml_memory_page **)(*in_RDI + 8);
      local_8->next = (xml_memory_page *)*in_RDI;
      *(xml_memory_page **)(*(long *)(*in_RDI + 8) + 0x10) = local_8;
      *(xml_memory_page **)(*in_RDI + 8) = local_8;
      local_8->busy_size = in_RSI;
    }
    local_8 = local_8 + 1;
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE void* xml_allocator::allocate_memory_oob(size_t size, xml_memory_page*& out_page)
	{
		const size_t large_allocation_threshold = xml_memory_page_size / 4;

		xml_memory_page* page = allocate_page(size <= large_allocation_threshold ? xml_memory_page_size : size);
		out_page = page;

		if (!page) return NULL;

		if (size <= large_allocation_threshold)
		{
			_root->busy_size = _busy_size;

			// insert page at the end of linked list
			page->prev = _root;
			_root->next = page;
			_root = page;

			_busy_size = size;
		}
		else
		{
			// insert page before the end of linked list, so that it is deleted as soon as possible
			// the last page is not deleted even if it's empty (see deallocate_memory)
			assert(_root->prev);

			page->prev = _root->prev;
			page->next = _root;

			_root->prev->next = page;
			_root->prev = page;

			page->busy_size = size;
		}

		return reinterpret_cast<char*>(page) + sizeof(xml_memory_page);
	}